

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_comm_and_stream_wrapper.hpp
# Opt level: O0

void __thiscall
Al::internal::MPICommAndStreamWrapper<int>::MPICommAndStreamWrapper
          (MPICommAndStreamWrapper<int> *this,MPI_Comm comm_,int stream_)

{
  undefined8 uVar1;
  undefined4 in_EDX;
  undefined *in_RSI;
  undefined4 *in_RDI;
  int in_stack_0000005c;
  string *in_stack_00000060;
  string *in_stack_00000068;
  undefined4 in_stack_00000070;
  char (*in_stack_00000118) [48];
  allocator<char> *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  
  *in_RDI = in_EDX;
  *(undefined **)(in_RDI + 2) = &ompi_mpi_comm_null;
  *(undefined **)(in_RDI + 4) = &ompi_mpi_comm_null;
  if (in_RSI == &ompi_mpi_comm_null) {
    uVar1 = __cxa_allocate_exception(0x70);
    build_string<char_const(&)[48]>(in_stack_00000118);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    al_exception::al_exception
              ((al_exception *)CONCAT44(stream_,in_stack_00000070),in_stack_00000068,
               in_stack_00000060,in_stack_0000005c);
    __cxa_throw(uVar1,&al_exception::typeinfo,al_exception::~al_exception);
  }
  MPI_Comm_dup(in_RSI,in_RDI + 2);
  MPI_Comm_rank(*(undefined8 *)(in_RDI + 2),in_RDI + 6);
  MPI_Comm_size(*(undefined8 *)(in_RDI + 2),in_RDI + 7);
  MPI_Comm_split_type(*(undefined8 *)(in_RDI + 2),0,0,&ompi_mpi_info_null,in_RDI + 4);
  MPI_Comm_rank(*(undefined8 *)(in_RDI + 4),in_RDI + 8);
  MPI_Comm_size(*(undefined8 *)(in_RDI + 4),in_RDI + 9);
  return;
}

Assistant:

MPICommAndStreamWrapper(MPI_Comm comm_, Stream stream_) :
    stream(stream_)
  {
    if (comm_ == MPI_COMM_NULL) {
      throw_al_exception("Cannot create a communicator with MPI_COMM_NULL");
    }

    // Duplicate the communicator to avoid interference.
    MPI_Comm_dup(comm_, &comm);
    MPI_Comm_rank(comm, &rank_in_comm);
    MPI_Comm_size(comm, &size_of_comm);
    MPI_Comm_split_type(comm, MPI_COMM_TYPE_SHARED, 0, MPI_INFO_NULL,
                        &local_comm);
    MPI_Comm_rank(local_comm, &rank_in_local_comm);
    MPI_Comm_size(local_comm, &size_of_local_comm);
  }